

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionarydata.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UCharsDictionaryMatcher::matches
          (UCharsDictionaryMatcher *this,UText *text,int32_t maxLength,int32_t limit,
          int32_t *lengths,int32_t *cpLengths,int32_t *values,int32_t *prefix)

{
  UChar UVar1;
  int32_t uchar;
  UStringTrieResult UVar2;
  int iVar3;
  int64_t iVar4;
  int64_t iVar5;
  uint uVar6;
  UChar *pUVar7;
  int32_t iVar8;
  int iVar9;
  UCharsTrie local_68;
  int32_t *local_48;
  int32_t *local_40;
  UChar *local_38;
  
  local_68.uchars_ = this->characters;
  local_68.ownedArray_ = (char16_t *)0x0;
  local_68.remainingMatchLength_ = -1;
  local_68.pos_ = local_68.uchars_;
  local_38 = local_68.uchars_;
  iVar4 = utext_getNativeIndex_63(text);
  local_48 = lengths;
  local_40 = cpLengths;
  uchar = utext_next32_63(text);
  iVar8 = 0;
  iVar9 = 0;
  do {
    if (uchar < 0) {
LAB_0038ac81:
      if (prefix != (int32_t *)0x0) {
        *prefix = iVar9;
      }
      UCharsTrie::~UCharsTrie(&local_68);
      return iVar8;
    }
    if (iVar9 == 0) {
      local_68.remainingMatchLength_ = -1;
      UVar2 = UCharsTrie::nextImpl(&local_68,local_68.uchars_,uchar);
    }
    else {
      UVar2 = UCharsTrie::next(&local_68,uchar);
    }
    iVar5 = utext_getNativeIndex_63(text);
    iVar3 = (int)iVar5 - (int)iVar4;
    if ((int)UVar2 < 2) {
      if (UVar2 != USTRINGTRIE_NO_MATCH) goto LAB_0038ac68;
LAB_0038ac7e:
      iVar9 = iVar9 + 1;
      goto LAB_0038ac81;
    }
    if (iVar8 < limit) {
      if (values != (int32_t *)0x0) {
        pUVar7 = local_68.pos_ + 1;
        UVar1 = *local_68.pos_;
        if (UVar1 < L'\0') {
          uVar6 = (ushort)UVar1 & 0x7fff;
          if (0x3fff < uVar6) {
            if (uVar6 == 0x7fff) {
              uVar6 = (uint)(ushort)local_68.pos_[1] << 0x10;
              pUVar7 = local_68.pos_ + 2;
            }
            else {
              uVar6 = uVar6 * 0x10000 + 0xc0000000;
            }
            uVar6 = (ushort)*pUVar7 | uVar6;
          }
        }
        else if ((ushort)UVar1 < 0x4040) {
          uVar6 = ((ushort)UVar1 >> 6) - 1;
        }
        else if ((ushort)UVar1 < 0x7fc0) {
          uVar6 = ((ushort)UVar1 & 0x7fc0) * 0x400 + (uint)(ushort)*pUVar7 + 0xfeff0000;
        }
        else {
          uVar6 = CONCAT22(local_68.pos_[1],local_68.pos_[2]);
        }
        values[iVar8] = uVar6;
      }
      if (local_48 != (int32_t *)0x0) {
        local_48[iVar8] = iVar3;
      }
      if (local_40 != (int32_t *)0x0) {
        local_40[iVar8] = iVar9 + 1;
      }
      iVar8 = iVar8 + 1;
    }
    if (UVar2 == USTRINGTRIE_FINAL_VALUE) goto LAB_0038ac7e;
LAB_0038ac68:
    if (maxLength <= iVar3) goto LAB_0038ac7e;
    uchar = utext_next32_63(text);
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

int32_t UCharsDictionaryMatcher::matches(UText *text, int32_t maxLength, int32_t limit,
                            int32_t *lengths, int32_t *cpLengths, int32_t *values,
                            int32_t *prefix) const {

    UCharsTrie uct(characters);
    int32_t startingTextIndex = (int32_t)utext_getNativeIndex(text);
    int32_t wordCount = 0;
    int32_t codePointsMatched = 0;

    for (UChar32 c = utext_next32(text); c >= 0; c=utext_next32(text)) {
        UStringTrieResult result = (codePointsMatched == 0) ? uct.first(c) : uct.next(c);
        int32_t lengthMatched = (int32_t)utext_getNativeIndex(text) - startingTextIndex;
        codePointsMatched += 1;
        if (USTRINGTRIE_HAS_VALUE(result)) {
            if (wordCount < limit) {
                if (values != NULL) {
                    values[wordCount] = uct.getValue();
                }
                if (lengths != NULL) {
                    lengths[wordCount] = lengthMatched;
                }
                if (cpLengths != NULL) {
                    cpLengths[wordCount] = codePointsMatched;
                }
                ++wordCount;
            }
            if (result == USTRINGTRIE_FINAL_VALUE) {
                break;
            }
        }
        else if (result == USTRINGTRIE_NO_MATCH) {
            break;
        }
        if (lengthMatched >= maxLength) {
            break;
        }
    }

    if (prefix != NULL) {
        *prefix = codePointsMatched;
    }
    return wordCount;
}